

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

int tidySetInCharEncoding(TidyDoc tdoc,ctmbstr encnam)

{
  uint uVar1;
  Bool BVar2;
  
  if (tdoc != (TidyDoc)0x0) {
    uVar1 = prvTidyCharEncodingId((TidyDocImpl *)tdoc,encnam);
    if ((-1 < (int)uVar1) &&
       (BVar2 = prvTidySetOptionInt((TidyDocImpl *)tdoc,TidyInCharEncoding,(ulong)uVar1),
       BVar2 != no)) {
      return 0;
    }
    prvTidyReportBadArgument((TidyDocImpl *)tdoc,"in-char-encoding");
  }
  return -0x16;
}

Assistant:

int TIDY_CALL           tidySetInCharEncoding( TidyDoc tdoc, ctmbstr encnam )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
    {
        int enc = TY_(CharEncodingId)( impl, encnam );
        if ( enc >= 0 && TY_(SetOptionInt)( impl, TidyInCharEncoding, enc ) )
            return 0;

        TY_(ReportBadArgument)( impl, "in-char-encoding" );
    }
    return -EINVAL;
}